

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrROL0x26(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  Memory *unaff_retaddr;
  uint16_t address;
  CPU *pCVar1;
  
  pCVar1 = in_RDI;
  zeropage_addr_j((CPU *)0x110398);
  argument = Memory::Read8(in_RDI->m,(uint16_t)((ulong)in_RDI >> 0x30));
  ROL(in_RDI,argument);
  Memory::Write8(unaff_retaddr,(uint16_t)((ulong)pCVar1 >> 0x30),(uint8_t)((ulong)pCVar1 >> 0x28));
  return 5;
}

Assistant:

int CPU::instrROL0x26() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, ROL(m->Read8(address)));
	return 5;
}